

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void do_ssi_exec(mg_connection *conn,char *tag)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  uint in_ECX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *func;
  int in_R8D;
  char *fmt;
  char cmd [1024];
  mg_file local_448;
  char local_418 [1023];
  undefined1 local_19;
  
  memset(local_418,0,0x400);
  local_448.stat.is_directory = 0;
  local_448.stat.is_gzipped = 0;
  local_448.stat.location = 0;
  local_448.stat._28_4_ = 0;
  local_448.stat.size = 0;
  local_448.stat.last_modified = 0;
  iVar1 = __isoc99_sscanf(tag," \"%1023[^\"]\"",local_418);
  if (iVar1 == 1) {
    local_19 = 0;
    __stream = popen(local_418,"r");
    local_448.access.fp = (FILE *)__stream;
    if (__stream != (FILE *)0x0) {
      send_file_data(conn,&local_448,0,0x7fffffffffffffff,in_R8D);
      pclose(__stream);
      return;
    }
    piVar2 = __errno_location();
    strerror(*piVar2);
    fmt = "Cannot SSI #exec: [%s]: %s";
    tag = local_418;
    func = extraout_RDX_00;
  }
  else {
    fmt = "Bad SSI #exec: [%s]";
    func = extraout_RDX;
  }
  mg_cry_internal_wrap(conn,(mg_context *)0x0,func,in_ECX,fmt,tag);
  return;
}

Assistant:

static void
do_ssi_exec(struct mg_connection *conn, char *tag)
{
	char cmd[1024] = "";
	struct mg_file file = STRUCT_FILE_INITIALIZER;

	if (sscanf(tag, " \"%1023[^\"]\"", cmd) != 1) {
		mg_cry_internal(conn, "Bad SSI #exec: [%s]", tag);
	} else {
		cmd[1023] = 0;
		if ((file.access.fp = popen(cmd, "r")) == NULL) {
			mg_cry_internal(conn,
			                "Cannot SSI #exec: [%s]: %s",
			                cmd,
			                strerror(ERRNO));
		} else {
			send_file_data(conn, &file, 0, INT64_MAX, 0); /* send static file */
			pclose(file.access.fp);
		}
	}
}